

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_int>::Swap
          (RepeatedFieldPrimitiveAccessor<unsigned_int> *this,Field *data,
          RepeatedFieldAccessor *other_mutator,Field *other_data)

{
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if ((RepeatedFieldAccessor *)this != other_mutator) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/reflection_internal.h"
               ,0x117);
    other = LogMessage::operator<<(&local_50,"CHECK failed: this == other_mutator: ");
    LogFinisher::operator=(&local_51,other);
    LogMessage::~LogMessage(&local_50);
  }
  RepeatedField<unsigned_int>::Swap
            ((RepeatedField<unsigned_int> *)data,(RepeatedField<unsigned_int> *)other_data);
  return;
}

Assistant:

void Swap(Field* data, const internal::RepeatedFieldAccessor* other_mutator,
            Field* other_data) const override {
    // Currently RepeatedFieldPrimitiveAccessor is the only implementation of
    // RepeatedFieldAccessor for primitive types. As we are using singletons
    // for these accessors, here "other_mutator" must be "this".
    GOOGLE_CHECK(this == other_mutator);
    MutableRepeatedField(data)->Swap(MutableRepeatedField(other_data));
  }